

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegerCondition.hpp
# Opt level: O0

Status __thiscall
AO::BehaviorTree::Version_1::Details::IntegerCondition<int,_Agent,_short>::decide
          (IntegerCondition<int,_Agent,_short> *this,EntityPtr entity,short args)

{
  int iVar1;
  int result;
  short args_local;
  EntityPtr entity_local;
  IntegerCondition<int,_Agent,_short> *this_local;
  
  iVar1 = std::function<int_(Agent_*,_short)>::operator()(&this->function,entity,args);
  switch(this->condition) {
  case LessThan:
    this_local._7_1_ = this->target <= iVar1;
    break;
  case GreaterThan:
    this_local._7_1_ = iVar1 <= this->target;
    break;
  case LessOrEqualThan:
    this_local._7_1_ = this->target < iVar1;
    break;
  case GreaterOrEqualThan:
    this_local._7_1_ = iVar1 < this->target;
    break;
  case Equal:
    this_local._7_1_ = iVar1 != this->target;
    break;
  case NotEqual:
    this_local._7_1_ = iVar1 == this->target;
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

Status decide(EntityPtr entity, Args...args) override final
					{
						IntegerType const result = function(entity, args...);
						switch (condition)
						{
						case ConditionTest::LessThan:
							return result < target ? Status::Success : Status::Failure;
						case ConditionTest::GreaterThan:
							return result > target ? Status::Success : Status::Failure;
						case ConditionTest::LessOrEqualThan:
							return result <= target ? Status::Success : Status::Failure;
						case ConditionTest::GreaterOrEqualThan:
							return result >= target ? Status::Success : Status::Failure;
						case ConditionTest::Equal:
							return result == target ? Status::Success : Status::Failure;
						case ConditionTest::NotEqual:
							return result != target ? Status::Success : Status::Failure;
						default:
							return Status::Failure;
						}
					}